

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<float,_float,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<float,_float,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          float *key,float *value)

{
  ulong uVar1;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<float>_> __value;
  STORAGE_TYPE *pSVar2;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<float>_> *__first;
  bool bVar3;
  idx_t iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  STORAGE_TYPE local_38;
  
  pSVar2 = this->heap;
  uVar7 = this->size;
  if (uVar7 < this->capacity) {
    pSVar2[uVar7].first.value = *key;
    pSVar2[uVar7].second.value = *value;
    this->size = uVar7 + 1;
    local_38 = pSVar2[uVar7];
    if (1 < (long)(uVar7 + 1)) {
      do {
        uVar1 = uVar7 - 1;
        uVar6 = uVar1 >> 1;
        bVar3 = duckdb::GreaterThan::Operation<float>((float *)&local_38,(float *)(pSVar2 + uVar6));
        if (!bVar3) goto LAB_004452e6;
        pSVar2[uVar7] = pSVar2[uVar6];
        uVar7 = uVar6;
      } while (1 < uVar1);
      uVar7 = 0;
    }
LAB_004452e6:
    pSVar2[uVar7] = local_38;
  }
  else {
    bVar3 = duckdb::GreaterThan::Operation<float>((float *)pSVar2,key);
    if (bVar3) {
      iVar4 = this->size;
      if (1 < (long)iVar4) {
        __first = this->heap;
        __value = __first[iVar4 - 1];
        __first[iVar4 - 1] = *__first;
        std::
        __adjust_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<float>>const&)>>
                  (__first,0,(long)(iVar4 * 8 + -8) >> 3,__value,
                   (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<float>_>_&)>
                    )Compare);
        iVar4 = this->size;
      }
      pSVar2 = this->heap;
      pSVar2[iVar4 - 1].first.value = *key;
      pSVar2[iVar4 - 1].second.value = *value;
      local_38 = pSVar2[iVar4 - 1];
      lVar5 = (long)(iVar4 * 8) >> 3;
      uVar7 = lVar5 - 1;
      if (1 < lVar5) {
        do {
          uVar1 = uVar7 - 1;
          uVar6 = uVar1 >> 1;
          bVar3 = duckdb::GreaterThan::Operation<float>
                            ((float *)&local_38,(float *)(pSVar2 + uVar6));
          if (!bVar3) goto LAB_004453b5;
          pSVar2[uVar7] = pSVar2[uVar6];
          uVar7 = uVar6;
        } while (1 < uVar1);
        uVar7 = 0;
      }
LAB_004453b5:
      pSVar2[uVar7] = local_38;
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}